

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.h
# Opt level: O3

void idx2::AllocPtr<idx2::hash_table<unsigned_long,idx2::chunk_exp_info>::bucket_status>
               (bucket_status **Ptr,i64 Size,allocator *Alloc)

{
  buffer local_38;
  
  if (Mallocator()::Instance == '\0') {
    AllocPtr<idx2::hash_table<unsigned_long,idx2::chunk_exp_info>::bucket_status>();
  }
  local_38.Data = (bucket_status *)0x0;
  local_38.Bytes = 0;
  local_38.Alloc = (allocator *)&Mallocator()::Instance;
  AllocBuf(&local_38,Size,Alloc);
  *Ptr = local_38.Data;
  return;
}

Assistant:

void
AllocPtr(t** Ptr, i64 Size, allocator* Alloc = &Mallocator())
{
  buffer RawBuf;
  AllocBuf(&RawBuf, i64(Size * sizeof(t)), Alloc);
  *Ptr = (t*)RawBuf.Data;
}